

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::Image::GLES2ImageApi::GLES2ImageApi
          (GLES2ImageApi *this,Library *egl,Functions *gl,int contextId,TestLog *log,
          EGLDisplay display,EGLSurface surface,EGLConfig config)

{
  ostringstream *this_00;
  Library *pLVar1;
  EGLSurface pvVar2;
  deUint32 dVar3;
  int iVar4;
  undefined4 extraout_var;
  EGLint configId;
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  (this->super_ImageApi)._vptr_ImageApi = (_func_int **)&PTR__ImageApi_02120928;
  (this->super_ImageApi).m_egl = egl;
  (this->super_ImageApi).m_contextId = contextId;
  (this->super_ImageApi).m_display = display;
  (this->super_ImageApi).m_surface = surface;
  glu::CallLogWrapper::CallLogWrapper(&this->super_CallLogWrapper,gl,log);
  (this->super_ImageApi)._vptr_ImageApi = (_func_int **)&PTR__GLES2ImageApi_02120948;
  this->m_context = (EGLContext)0x0;
  this->m_gl = gl;
  local_1c0 = 0x200003098;
  local_1b8 = 0x3038;
  pLVar1 = (this->super_ImageApi).m_egl;
  (*pLVar1->_vptr_Library[0x19])(pLVar1,(this->super_ImageApi).m_display,config,0x3028);
  dVar3 = (*((this->super_ImageApi).m_egl)->_vptr_Library[0x1f])();
  eglu::checkError(dVar3,"getConfigAttrib(m_display, config, EGL_CONFIG_ID, &configId)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                   ,0x123);
  local_1b0._0_8_ = (this->super_CallLogWrapper).m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Creating gles2 context with config id: ",0x27);
  std::ostream::operator<<(this_00,-1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," context: ",10);
  std::ostream::operator<<(this_00,(this->super_ImageApi).m_contextId);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  (**egl->_vptr_Library)(egl,0x30a0);
  pLVar1 = (this->super_ImageApi).m_egl;
  iVar4 = (*pLVar1->_vptr_Library[6])(pLVar1,(this->super_ImageApi).m_display,config,0,&local_1c0);
  this->m_context = (EGLContext)CONCAT44(extraout_var,iVar4);
  dVar3 = (*((this->super_ImageApi).m_egl)->_vptr_Library[0x1f])();
  eglu::checkError(dVar3,"Failed to create GLES2 context",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                   ,0x127);
  pvVar2 = (this->super_ImageApi).m_surface;
  (*egl->_vptr_Library[0x27])(egl,display,pvVar2,pvVar2,this->m_context);
  dVar3 = (*((this->super_ImageApi).m_egl)->_vptr_Library[0x1f])();
  eglu::checkError(dVar3,"Failed to make context current",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                   ,0x12a);
  return;
}

Assistant:

GLES2ImageApi::GLES2ImageApi (const Library& egl, const glw::Functions& gl, int contextId, tcu::TestLog& log, EGLDisplay display, EGLSurface surface, EGLConfig config)
	: ImageApi				(egl, contextId, display, surface)
	, glu::CallLogWrapper	(gl, log)
	, m_context				(DE_NULL)
	, m_gl					(gl)
{
	const EGLint attriblist[] =
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};

	EGLint configId = -1;
	EGLU_CHECK_CALL(m_egl, getConfigAttrib(m_display, config, EGL_CONFIG_ID, &configId));
	getLog() << tcu::TestLog::Message << "Creating gles2 context with config id: " << configId << " context: " << m_contextId << tcu::TestLog::EndMessage;
	egl.bindAPI(EGL_OPENGL_ES_API);
	m_context = m_egl.createContext(m_display, config, EGL_NO_CONTEXT, attriblist);
	EGLU_CHECK_MSG(m_egl, "Failed to create GLES2 context");

	egl.makeCurrent(display, m_surface, m_surface, m_context);
	EGLU_CHECK_MSG(m_egl, "Failed to make context current");
}